

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vwdll.cpp
# Opt level: O2

void VW_SaveModel(VW_HANDLE handle)

{
  string name;
  string local_50;
  string local_30 [8];
  long local_28;
  
  std::__cxx11::string::string(local_30,(string *)((long)handle + 0x3570));
  if (local_28 != 0) {
    std::__cxx11::string::string((string *)&local_50,local_30);
    VW::save_predictor((vw *)handle,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

VW_DLL_MEMBER void VW_CALLING_CONV VW_SaveModel(VW_HANDLE handle)
{ vw* pointer = static_cast<vw*>(handle);

  string name = pointer->final_regressor_name;
  if (name.empty())
  { return;
  }

  return VW::save_predictor(*pointer, name);
}